

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall
wallet::LegacyDataSPKM::AddCryptedKeyInner
          (LegacyDataSPKM *this,CPubKey *vchPubKey,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchCryptedSecret)

{
  mapped_type *pmVar1;
  long lVar2;
  undefined8 *puVar3;
  mapped_type *pmVar4;
  long in_FS_OFFSET;
  byte bVar5;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock23;
  unique_lock<std::recursive_mutex> local_b0;
  CKeyID local_9c;
  undefined8 local_88 [8];
  uchar local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  long local_28;
  
  bVar5 = 0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0._M_device = &(this->super_FillableSigningProvider).cs_KeyStore.super_recursive_mutex;
  local_b0._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_b0);
  if ((this->super_FillableSigningProvider).mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count
      != 0) {
    __assert_fail("mapKeys.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x35e,
                  "bool wallet::LegacyDataSPKM::AddCryptedKeyInner(const CPubKey &, const std::vector<unsigned char> &)"
                 );
  }
  memcpy(local_88,vchPubKey,0x41);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_40,vchCryptedSecret);
  CPubKey::GetID(&local_9c,vchPubKey);
  pmVar1 = std::
           map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
           ::operator[](&this->mapCryptedKeys,&local_9c);
  puVar3 = local_88;
  pmVar4 = pmVar1;
  for (lVar2 = 8; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined8 *)(pmVar4->first).vch = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    pmVar4 = (mapped_type *)((long)pmVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  (pmVar1->first).vch[0x40] = local_48;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&pmVar1->second,&local_40);
  if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  FillableSigningProvider::ImplicitlyLearnRelatedKeyScripts
            (&this->super_FillableSigningProvider,vchPubKey);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::AddCryptedKeyInner(const CPubKey &vchPubKey, const std::vector<unsigned char> &vchCryptedSecret)
{
    LOCK(cs_KeyStore);
    assert(mapKeys.empty());

    mapCryptedKeys[vchPubKey.GetID()] = make_pair(vchPubKey, vchCryptedSecret);
    ImplicitlyLearnRelatedKeyScripts(vchPubKey);
    return true;
}